

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaDemuxer.cpp
# Opt level: O3

int __thiscall MatroskaDemuxer::ebml_read_header(MatroskaDemuxer *this,char **doctype,int *version)

{
  uint32_t *puVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 *puVar4;
  uint32_t uVar5;
  bool bVar6;
  int levelUp;
  int64_t num;
  uint32_t id;
  int local_240;
  uint32_t local_23c;
  long local_238;
  uint *local_230;
  undefined8 local_228;
  uint local_220;
  undefined4 uStack_21c;
  undefined4 uStack_218;
  undefined4 uStack_214;
  uint *local_210;
  undefined8 local_208;
  uint local_200;
  undefined4 uStack_1fc;
  undefined4 uStack_1f8;
  undefined4 uStack_1f4;
  uint *local_1f0;
  undefined8 local_1e8;
  uint local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  uint *local_1d0;
  undefined8 local_1c8;
  uint local_1c0;
  undefined4 uStack_1bc;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  uint32_t *local_1b0;
  undefined8 local_1a8;
  
  if (doctype != (char **)0x0) {
    *doctype = (char *)0x0;
  }
  if (version != (int *)0x0) {
    *version = 1;
  }
  iVar2 = ebml_read_element_id(this,(uint32_t *)&local_1a8,&local_240);
  uVar5 = 0;
  if (-1 < iVar2) {
    uVar5 = (uint32_t)local_1a8;
  }
  if ((uVar5 != 0x1a45dfa3) || (local_240 != 0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"This is not an EBML file (id=",0x1d);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    puVar4 = (undefined4 *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    *puVar4 = 900;
    *(undefined4 **)(puVar4 + 2) = puVar4 + 6;
    if (local_1d0 == &local_1c0) {
      puVar4[6] = local_1c0;
      puVar4[7] = uStack_1bc;
      puVar4[8] = uStack_1b8;
      puVar4[9] = uStack_1b4;
    }
    else {
      *(uint **)(puVar4 + 2) = local_1d0;
      *(ulong *)(puVar4 + 6) = CONCAT44(uStack_1bc,local_1c0);
    }
    *(undefined8 *)(puVar4 + 4) = local_1c8;
    local_1c8 = 0;
    local_1c0 = local_1c0 & 0xffffff00;
    local_1d0 = &local_1c0;
    __cxa_throw(puVar4,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  iVar2 = ebml_read_master(this,&local_23c);
  if (iVar2 < 0) {
    return iVar2;
  }
  local_1b0 = (uint32_t *)version;
  do {
    iVar2 = ebml_read_element_id(this,(uint32_t *)&local_1a8,&local_240);
    puVar1 = local_1b0;
    if (iVar2 < 0) {
      return -1;
    }
    if ((uint32_t)local_1a8 == 0) {
      return -1;
    }
    if (local_240 != 0) {
      return 0;
    }
    if ((int)(uint32_t)local_1a8 < 0x4286) {
      if (0x4281 < (int)(uint32_t)local_1a8) {
        if ((uint32_t)local_1a8 == 0x4282) {
          iVar2 = ebml_read_ascii(this,&local_23c,(char **)&local_1a8);
          if (iVar2 < 0 || doctype == (char **)0x0) {
            if (iVar2 < 0) {
              return iVar2;
            }
          }
          else {
            *doctype = (char *)CONCAT44(local_1a8._4_4_,(uint32_t)local_1a8);
          }
          goto LAB_0019a8aa;
        }
        if ((uint32_t)local_1a8 == 0x4285) {
          bVar6 = local_1b0 == (uint32_t *)0x0;
          iVar2 = ebml_read_uint(this,&local_23c,&local_1a8);
          if (iVar2 < 0 || bVar6) {
            if (iVar2 < 0) {
              return iVar2;
            }
          }
          else {
            *puVar1 = (uint32_t)local_1a8;
          }
          iVar2 = 0;
          goto LAB_0019a8ac;
        }
      }
LAB_0019a7b0:
      iVar2 = ebml_read_skip(this);
    }
    else {
      if ((int)(uint32_t)local_1a8 < 0x42f3) {
        if (((uint32_t)local_1a8 - 0x4286 < 2) || ((uint32_t)local_1a8 != 0x42f2))
        goto LAB_0019a7b0;
        iVar2 = ebml_read_uint(this,&local_23c,&local_238);
        if (iVar2 < 0) {
          return iVar2;
        }
        if (8 < local_238) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,"IDs of size ",0xc);
          poVar3 = std::ostream::_M_insert<long>((long)&local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," (> 8) not supported",0x14);
          puVar4 = (undefined4 *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          *puVar4 = 900;
          *(undefined4 **)(puVar4 + 2) = puVar4 + 6;
          if (local_230 == &local_220) {
            puVar4[6] = local_220;
            puVar4[7] = uStack_21c;
            puVar4[8] = uStack_218;
            puVar4[9] = uStack_214;
          }
          else {
            *(uint **)(puVar4 + 2) = local_230;
            *(ulong *)(puVar4 + 6) = CONCAT44(uStack_21c,local_220);
          }
          *(undefined8 *)(puVar4 + 4) = local_228;
          local_228 = 0;
          local_220 = local_220 & 0xffffff00;
          local_230 = &local_220;
          __cxa_throw(puVar4,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
        }
      }
      else if ((uint32_t)local_1a8 == 0x42f3) {
        iVar2 = ebml_read_uint(this,&local_23c,&local_238);
        if (iVar2 < 0) {
          return iVar2;
        }
        if (8 < local_238) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,"Integers of size ",0x11);
          poVar3 = std::ostream::_M_insert<long>((long)&local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," (> 8) not supported",0x14);
          puVar4 = (undefined4 *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          *puVar4 = 900;
          *(undefined4 **)(puVar4 + 2) = puVar4 + 6;
          if (local_210 == &local_200) {
            puVar4[6] = local_200;
            puVar4[7] = uStack_1fc;
            puVar4[8] = uStack_1f8;
            puVar4[9] = uStack_1f4;
          }
          else {
            *(uint **)(puVar4 + 2) = local_210;
            *(ulong *)(puVar4 + 6) = CONCAT44(uStack_1fc,local_200);
          }
          *(undefined8 *)(puVar4 + 4) = local_208;
          local_208 = 0;
          local_200 = local_200 & 0xffffff00;
          local_210 = &local_200;
          __cxa_throw(puVar4,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
        }
      }
      else {
        if ((uint32_t)local_1a8 != 0x42f7) goto LAB_0019a7b0;
        iVar2 = ebml_read_uint(this,&local_23c,&local_238);
        if (iVar2 < 0) {
          return iVar2;
        }
        if (1 < local_238) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,"EBML version ",0xd);
          poVar3 = std::ostream::_M_insert<long>((long)&local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," > ",3);
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," is not supported",0x11);
          puVar4 = (undefined4 *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          *puVar4 = 900;
          *(undefined4 **)(puVar4 + 2) = puVar4 + 6;
          if (local_1f0 == &local_1e0) {
            puVar4[6] = local_1e0;
            puVar4[7] = uStack_1dc;
            puVar4[8] = uStack_1d8;
            puVar4[9] = uStack_1d4;
          }
          else {
            *(uint **)(puVar4 + 2) = local_1f0;
            *(ulong *)(puVar4 + 6) = CONCAT44(uStack_1dc,local_1e0);
          }
          *(undefined8 *)(puVar4 + 4) = local_1e8;
          local_1e8 = 0;
          local_1e0 = local_1e0 & 0xffffff00;
          local_1f0 = &local_1e0;
          __cxa_throw(puVar4,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
        }
      }
LAB_0019a8aa:
      iVar2 = 0;
    }
LAB_0019a8ac:
    if (iVar2 != 0) {
      return 0;
    }
  } while( true );
}

Assistant:

int MatroskaDemuxer::ebml_read_header(char **doctype, int *version)
{
    uint32_t id;
    int levelUp, res = 0;

    /* default init */
    if (doctype)
        *doctype = nullptr;
    if (version)
        *version = 1;

    if ((id = ebml_peek_id(&levelUp)) == 0 || levelUp != 0 || id != EBML_ID_HEADER)
    {
        THROW(ERR_MATROSKA_PARSE, "This is not an EBML file (id=" << id << "/" << EBML_ID_HEADER)
    }
    if ((res = ebml_read_master(&id)) < 0)
        return res;

    while (res == 0)
    {
        if ((id = ebml_peek_id(&levelUp)) == 0)
            return -BufferedReader::DATA_EOF;

        /* end-of-header */
        if (levelUp)
            break;

        switch (id)
        {
        /* is our read version uptodate? */
        case EBML_ID_EBMLREADVERSION:
        {
            int64_t num;
            if ((res = ebml_read_uint(&id, &num)) < 0)
                return res;
            if (num > EBML_VERSION)
            {
                THROW(ERR_MATROSKA_PARSE, "EBML version " << num << " > " << EBML_VERSION << " is not supported")
            }
            break;
        }

        /* we only handle 8 byte lengths at max */
        case EBML_ID_EBMLMAXSIZELENGTH:
        {
            int64_t num;

            if ((res = ebml_read_uint(&id, &num)) < 0)
                return res;
            if (num > 8)
            {
                THROW(ERR_MATROSKA_PARSE, "Integers of size " << num << " (> 8) not supported")
            }
            break;
        }

        /* we handle 4 byte IDs at max */
        case EBML_ID_EBMLMAXIDLENGTH:
        {
            int64_t num;

            if ((res = ebml_read_uint(&id, &num)) < 0)
                return res;
            if (num > 8)
            {
                THROW(ERR_MATROSKA_PARSE, "IDs of size " << num << " (> 8) not supported")
            }
            break;
        }

        case EBML_ID_DOCTYPE:
        {
            char *text;

            if ((res = ebml_read_ascii(&id, &text)) < 0)
                return res;
            if (doctype)
            {
                *doctype = text;
            }
            break;
        }

        case EBML_ID_DOCTYPEREADVERSION:
        {
            int64_t num;

            if ((res = ebml_read_uint(&id, &num)) < 0)
                return res;
            if (version)
                *version = static_cast<int>(num);
            break;
        }
        /* we ignore these four, as they don't tell us anything we care about */
        case EBML_ID_VOID:
        case EBML_ID_CRC32:
        case EBML_ID_EBMLVERSION:
        case EBML_ID_DOCTYPEVERSION:
            res = ebml_read_skip();
            break;
        default:
            res = ebml_read_skip();
            LTRACE(LT_INFO, 0, "Unknown data type " << id << " in EBML header");
        }
    }

    return 0;
}